

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.hpp
# Opt level: O2

void __thiscall
asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::cancel
          (basic_socket<asio::ip::udp,_asio::any_io_executor> *this)

{
  error_code ec;
  error_code local_20;
  
  local_20._M_value = 0;
  local_20._M_cat = (error_category *)std::_V2::system_category();
  asio::detail::reactive_socket_service_base::cancel
            ((reactive_socket_service_base *)
             &((this->impl_).service_)->super_reactive_socket_service_base,
             &(this->impl_).implementation_.super_base_implementation_type,&local_20);
  asio::detail::throw_error(&local_20,"cancel");
  return;
}

Assistant:

void cancel()
  {
    asio::error_code ec;
    impl_.get_service().cancel(impl_.get_implementation(), ec);
    asio::detail::throw_error(ec, "cancel");
  }